

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ED.cpp
# Opt level: O1

void __thiscall
ED::ED(ED *this,short *_gradImg,uchar *_dirImg,int _width,int _height,int _gradThresh,
      int _anchorThresh,int _scanInterval,int _minPathLen,bool selectStableAnchors)

{
  short sVar1;
  pointer pPVar2;
  uchar *puVar3;
  short *psVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  ulong uVar18;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> local_b8 [4];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  (this->segmentPoints).
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->segmentPoints).
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->segmentPoints).
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cv::Mat::Mat(&this->smoothImage);
  cv::Mat::Mat(&this->srcImage);
  (this->edgePoints).super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->edgePoints).super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->anchorPoints).super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->edgePoints).super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->anchorPoints).super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->anchorPoints).super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cv::Mat::Mat(&this->edgeImage);
  cv::Mat::Mat(&this->gradImage);
  this->height = _height;
  this->width = _width;
  this->gradThresh = _gradThresh;
  this->anchorThresh = _anchorThresh;
  this->scanInterval = _scanInterval;
  this->minPathLen = _minPathLen;
  this->gradImg = _gradImg;
  this->dirImg = _dirImg;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  cv::Mat::Mat((Mat *)local_b8,_height,_width,0,(Scalar_ *)&local_58);
  cv::Mat::operator=(&this->edgeImage,(Mat *)local_b8);
  cv::Mat::~Mat((Mat *)local_b8);
  this->edgeImg = *(uchar **)&this->field_0x150;
  if (selectStableAnchors) {
    this->anchorThresh = 0;
    ComputeAnchorPoints(this);
    this->anchorThresh = _anchorThresh;
    pPVar2 = (this->anchorPoints).
             super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->anchorPoints).super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
        _M_impl.super__Vector_impl_data._M_finish != pPVar2) {
      (this->anchorPoints).super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = pPVar2;
    }
    if (2 < this->height) {
      iVar6 = 1;
      iVar7 = 2;
      iVar8 = 0;
      do {
        iVar12 = this->width;
        if (2 < iVar12) {
          lVar11 = 1;
          do {
            puVar3 = this->edgeImg;
            lVar14 = (long)(iVar6 * iVar12);
            if (puVar3[lVar11 + lVar14] == 0xfe) {
              lVar15 = lVar14 + lVar11;
              iVar10 = (int)lVar11;
              if ((puVar3[lVar11 + -1 + lVar14] == '\0') || (puVar3[lVar11 + 1 + lVar14] == '\0')) {
                lVar17 = (long)(iVar8 * iVar12 + iVar10);
                if ((puVar3[lVar17] == '\0') || (puVar3[iVar7 * iVar12 + iVar10] == '\0')) {
                  if ((puVar3[lVar17 + -1] == '\0') ||
                     (lVar9 = (long)(iVar7 * iVar12 + iVar10), puVar3[lVar9 + 1] == '\0')) {
                    if ((puVar3[lVar17 + 1] != '\0') &&
                       (lVar9 = (long)(iVar12 * iVar7 + iVar10), puVar3[lVar9 + -1] != '\0')) {
                      psVar4 = this->gradImg;
                      iVar13 = (int)psVar4[lVar15];
                      iVar16 = this->anchorThresh;
                      if (iVar16 <= iVar13 - psVar4[lVar17 + -1]) {
                        sVar1 = psVar4[lVar9 + 1];
                        goto LAB_00107621;
                      }
                    }
                  }
                  else {
                    psVar4 = this->gradImg;
                    if ((this->anchorThresh <= (int)psVar4[lVar15] - (int)psVar4[lVar17 + 1]) &&
                       (this->anchorThresh <= (int)psVar4[lVar15] - (int)psVar4[lVar9 + -1]))
                    goto LAB_001076e4;
                  }
                }
                else {
                  psVar4 = this->gradImg;
                  if ((this->anchorThresh <= (int)psVar4[lVar15] - (int)psVar4[lVar15 + -1]) &&
                     (this->anchorThresh <= (int)psVar4[lVar15] - (int)psVar4[lVar15 + 1])) {
LAB_001076e4:
                    puVar3[lVar11 + lVar14] = 0xff;
                  }
                }
              }
              else {
                psVar4 = this->gradImg;
                iVar13 = (int)psVar4[lVar15];
                iVar16 = this->anchorThresh;
                if (iVar16 <= iVar13 - psVar4[iVar8 * iVar12 + iVar10]) {
                  sVar1 = psVar4[iVar12 * iVar7 + iVar10];
LAB_00107621:
                  if (iVar16 <= iVar13 - sVar1) goto LAB_001076e4;
                }
              }
            }
            iVar12 = this->width;
            lVar11 = lVar11 + 1;
          } while ((int)lVar11 < iVar12 + -1);
        }
        iVar6 = iVar6 + 1;
        iVar7 = iVar7 + 1;
        iVar8 = iVar8 + 1;
      } while (iVar6 < this->height + -1);
    }
    if (0 < this->height * this->width) {
      uVar18 = 0;
      do {
        puVar3 = this->edgeImg;
        if (puVar3[uVar18] == 0xff) {
          puVar3[uVar18] = 0xfe;
          uVar5 = (ulong)(uint)((int)uVar18 >> 0x1f) << 0x20 | uVar18 & 0xffffffff;
          local_b8[0].super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl
          .super__Vector_impl_data._M_start._4_4_ = (int)((long)uVar5 / (long)this->width);
          local_b8[0].super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl
          .super__Vector_impl_data._M_start._0_4_ = (int)((long)uVar5 % (long)this->width);
          std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>::
          emplace_back<cv::Point_<int>>
                    ((vector<cv::Point_<int>,std::allocator<cv::Point_<int>>> *)&this->anchorPoints,
                     (Point_<int> *)local_b8);
        }
        else if (puVar3[uVar18] == 0xfe) {
          puVar3[uVar18] = '\0';
        }
        uVar18 = uVar18 + 1;
      } while ((long)uVar18 < (long)this->height * (long)this->width);
    }
    this->anchorNos =
         (int)((ulong)((long)(this->anchorPoints).
                             super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->anchorPoints).
                            super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                            _M_impl.super__Vector_impl_data._M_start) >> 3);
  }
  else {
    ComputeAnchorPoints(this);
  }
  this->segmentNos = 0;
  local_b8[0].super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8[0].super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8[0].super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,std::allocator<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>>
  ::emplace_back<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>
            ((vector<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,std::allocator<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>>
              *)&this->segmentPoints,local_b8);
  if ((Point_<int>)
      local_b8[0].super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
      super__Vector_impl_data._M_start != (Point_<int>)0x0) {
    operator_delete(local_b8[0].
                    super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  JoinAnchorPointsUsingSortedAnchors(this);
  return;
}

Assistant:

ED::ED(short *_gradImg, uchar *_dirImg, int _width, int _height, int _gradThresh, int _anchorThresh, int _scanInterval, int _minPathLen, bool selectStableAnchors)
{
	height = _height;
	width = _width;

	gradThresh = _gradThresh;
	anchorThresh = _anchorThresh;
	scanInterval = _scanInterval;
	minPathLen = _minPathLen;

	gradImg = _gradImg;
	dirImg = _dirImg;

	edgeImage = Mat(height, width, CV_8UC1, Scalar(0)); // initialize edge Image

	edgeImg = edgeImage.data;

	if (selectStableAnchors) {

		// Compute anchors with the user supplied parameters
		anchorThresh = 0; // anchorThresh used as zero while computing anchor points if selectStableAnchors set. 
						  // Finding higher number of anchors is OK, because we have following validation steps in selectStableAnchors.
		ComputeAnchorPoints();
		anchorThresh = _anchorThresh; // set it to its initial argument value for further anchor validation.
		anchorPoints.clear(); // considering validation step below, it should constructed again.

		for (int i = 1; i<height - 1; i++) {
			for (int j = 1; j<width - 1; j++) {
				if (edgeImg[i*width + j] != ANCHOR_PIXEL) continue;

				// Take only "stable" anchors
				// 0 degree edge
				if (edgeImg[i*width + j - 1] && edgeImg[i*width + j + 1]) {
					int diff1 = gradImg[i*width + j] - gradImg[(i - 1)*width + j];
					int diff2 = gradImg[i*width + j] - gradImg[(i + 1)*width + j];
					if (diff1 >= anchorThresh && diff2 >= anchorThresh) edgeImg[i*width + j] = 255;

					continue;
				} //end-if

				  // 90 degree edge
				if (edgeImg[(i - 1)*width + j] && edgeImg[(i + 1)*width + j]) {
					int diff1 = gradImg[i*width + j] - gradImg[i*width + j - 1];
					int diff2 = gradImg[i*width + j] - gradImg[i*width + j + 1];
					if (diff1 >= anchorThresh && diff2 >= anchorThresh) edgeImg[i*width + j] = 255;

					continue;
				} //end-if

				  // 135 degree diagonal
				if (edgeImg[(i - 1)*width + j - 1] && edgeImg[(i + 1)*width + j + 1]) {
					int diff1 = gradImg[i*width + j] - gradImg[(i - 1)*width + j + 1];
					int diff2 = gradImg[i*width + j] - gradImg[(i + 1)*width + j - 1];
					if (diff1 >= anchorThresh && diff2 >= anchorThresh) edgeImg[i*width + j] = 255;
					continue;
				} //end-if

				  // 45 degree diagonal
				if (edgeImg[(i - 1)*width + j + 1] && edgeImg[(i + 1)*width + j - 1]) {
					int diff1 = gradImg[i*width + j] - gradImg[(i - 1)*width + j - 1];
					int diff2 = gradImg[i*width + j] - gradImg[(i + 1)*width + j + 1];
					if (diff1 >= anchorThresh && diff2 >= anchorThresh) edgeImg[i*width + j] = 255;
				} //end-if

			} //end-for
		} //end-for

		for (int i = 0; i<width*height; i++) 
			if (edgeImg[i] == ANCHOR_PIXEL) 
				edgeImg[i] = 0; 
			else if (edgeImg[i] == 255) {
				edgeImg[i] = ANCHOR_PIXEL;
				int y = i / width;
				int x = i % width;
				anchorPoints.push_back(Point(x, y)); // push validated anchor point to vector
			}
			
		anchorNos = (int)anchorPoints.size(); // get # of anchor pixels
	}

	else {
		// Compute anchors with the user supplied parameters
		ComputeAnchorPoints(); // anchorThresh used as given as argument. No validation applied. (No stable anchors.)
	} //end-else

	segmentNos = 0;
	segmentPoints.push_back(vector<Point>()); // create empty vector of points for segments

	JoinAnchorPointsUsingSortedAnchors();
}